

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::path_to_co_ord(three_dim_model *this,Path *in_path,co_ord *out_co_ord)

{
  bool bVar1;
  pointer pIVar2;
  value_type_conflict1 local_78 [5];
  value_type_conflict1 local_64;
  __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_60;
  const_iterator i;
  const_iterator path_it_end;
  co_ord holder_co_ord;
  co_ord *out_co_ord_local;
  Path *in_path_local;
  three_dim_model *this_local;
  
  holder_co_ord.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)out_co_ord;
  co_ord::co_ord((co_ord *)&path_it_end);
  i = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::end(in_path);
  local_60._M_current =
       (IntPoint *)
       std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin(in_path);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_60,&i);
    if (!bVar1) break;
    pIVar2 = __gnu_cxx::
             __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
             ::operator->(&local_60);
    local_64 = (value_type_conflict1)pIVar2->X;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&path_it_end,&local_64);
    pIVar2 = __gnu_cxx::
             __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
             ::operator->(&local_60);
    local_78[0] = (value_type_conflict1)pIVar2->Y;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &holder_co_ord.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_78);
    __gnu_cxx::
    __normal_iterator<const_ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
    ::operator++(&local_60,0);
  }
  co_ord::operator=((co_ord *)
                    holder_co_ord.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(co_ord *)&path_it_end);
  co_ord::~co_ord((co_ord *)&path_it_end);
  return;
}

Assistant:

void MODEL3D::three_dim_model::path_to_co_ord(const ClipperLib::Path &in_path, co_ord &out_co_ord)
{
    co_ord holder_co_ord;
    //For each clipper point, push onto co_ord
    auto path_it_end = in_path.end();
    for (auto i = in_path.begin(); i != path_it_end; i++)
    {
        holder_co_ord.x.push_back(i->X);
        holder_co_ord.y.push_back(i->Y);
    }
    out_co_ord = holder_co_ord;
}